

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

void __thiscall MixedArena::~MixedArena(MixedArena *this)

{
  MixedArena *this_00;
  
  clear(this);
  if ((this->next)._M_b._M_p != (__pointer_type)0x0) {
    this_00 = (this->next)._M_b._M_p;
    if (this_00 != (MixedArena *)0x0) {
      ~MixedArena(this_00);
    }
    operator_delete(this_00,0x30);
  }
  std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
            ((_Vector_base<void_*,_std::allocator<void_*>_> *)this);
  return;
}

Assistant:

~MixedArena() {
    clear();
    if (next.load()) {
      delete next.load();
    }
  }